

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O0

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
duckdb::UniqueConstraint::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  pointer ret;
  pointer pUVar1;
  Deserializer *in_RSI;
  Constraint *in_RDI;
  unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true> result;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
  *in_stack_ffffffffffffff90;
  bool *in_stack_ffffffffffffff98;
  Deserializer *ret_00;
  UniqueConstraint *in_stack_ffffffffffffffa0;
  field_id_t field_id;
  Deserializer *this_00;
  _Head_base<0UL,_duckdb::Constraint_*,_false> _Var2;
  undefined1 local_18 [8];
  Deserializer *local_10;
  
  _Var2._M_head_impl = in_RDI;
  local_10 = in_RSI;
  this = (Deserializer *)operator_new(0x38);
  UniqueConstraint(in_stack_ffffffffffffffa0);
  field_id = (field_id_t)((ulong)local_18 >> 0x30);
  unique_ptr<duckdb::UniqueConstraint,std::default_delete<duckdb::UniqueConstraint>,true>::
  unique_ptr<std::default_delete<duckdb::UniqueConstraint>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = local_10;
  ret = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>::
        operator->(in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<bool>
            (this_00,field_id,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ret_00 = local_10;
  pUVar1 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->(in_stack_ffffffffffffff90);
  Deserializer::ReadProperty<duckdb::LogicalIndex>
            (this_00,field_id,(char *)pUVar1,(LogicalIndex *)ret_00);
  pUVar1 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->(in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (this,(field_id_t)((ulong)_Var2._M_head_impl >> 0x30),(char *)in_RDI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)ret);
  unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
  unique_ptr<duckdb::UniqueConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
            ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)pUVar1
             ,(unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>_>
               *)local_10);
  unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>::
  ~unique_ptr((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
               *)0xacc3d6);
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<Constraint> UniqueConstraint::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<UniqueConstraint>(new UniqueConstraint());
	deserializer.ReadPropertyWithDefault<bool>(200, "is_primary_key", result->is_primary_key);
	deserializer.ReadProperty<LogicalIndex>(201, "index", result->index);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "columns", result->columns);
	return std::move(result);
}